

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFx.c
# Opt level: O1

void Bmc_FxAddClauses(sat_solver *pSat,Vec_Int_t *vDivs,int iCiVarBeg,int iVarStart)

{
  int *piVar1;
  sat_solver *psVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  undefined4 in_register_00000014;
  uint uVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint local_94;
  uint local_90;
  uint local_8c;
  uint local_88;
  uint local_84;
  sat_solver *local_80;
  int local_78;
  uint local_74;
  undefined8 local_70;
  Vec_Int_t *local_68;
  long local_60;
  uint local_54;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  long local_38;
  
  local_70 = CONCAT44(in_register_00000014,iCiVarBeg);
  uVar13 = vDivs->nSize;
  uVar3 = uVar13 + 3;
  if (-1 < (int)uVar13) {
    uVar3 = uVar13;
  }
  if ((uVar13 & 3) != 0) {
    __assert_fail("Vec_IntSize(vDivs) % 4 == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcFx.c"
                  ,0x28a,"void Bmc_FxAddClauses(sat_solver *, Vec_Int_t *, int, int)");
  }
  if (3 < (int)uVar13) {
    uVar3 = (int)uVar3 >> 2;
    local_78 = iCiVarBeg * 2;
    uVar13 = (uVar3 + iVarStart) * 2;
    uVar11 = (uVar3 + iVarStart) * 2 - 1;
    local_38 = (ulong)uVar3 << 2;
    lVar10 = 0;
    uVar3 = uVar3 + iVarStart;
    local_80 = pSat;
    local_68 = vDivs;
    do {
      iVar6 = local_78;
      psVar2 = local_80;
      uVar13 = uVar13 - 2;
      uVar3 = uVar3 - 1;
      lVar7 = (long)local_68->nSize;
      if ((((lVar7 <= lVar10) || (lVar7 <= lVar10 + 1)) || (lVar7 <= lVar10 + 2)) ||
         (local_84 = uVar13, lVar7 <= lVar10 + 3)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar1 = local_68->pArray;
      iVar5 = piVar1[lVar10];
      uVar14 = piVar1[lVar10 + 1];
      uVar15 = piVar1[lVar10 + 2];
      iVar4 = (int)local_70;
      local_88 = uVar11;
      local_74 = uVar3;
      local_60 = lVar10;
      if (iVar5 == 3) {
        if (((int)uVar14 < 0) || ((int)uVar15 < 0)) {
LAB_0053ac36:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                        ,0xf2,"int Abc_Lit2Var(int)");
        }
        uVar11 = piVar1[lVar10 + 3];
        if ((int)uVar11 < 0) goto LAB_0053ac36;
        uVar9 = (uVar14 >> 1) + iVar4;
        local_48 = (ulong)(uVar15 >> 1);
        uVar12 = (uVar15 >> 1) + iVar4;
        local_50 = (ulong)(uVar11 >> 1);
        uVar8 = (uVar11 >> 1) + iVar4;
        local_40 = (ulong)uVar11;
        if ((int)(uVar9 | uVar3 | uVar12 | uVar8) < 0) {
          __assert_fail("iVarC >= 0 && iVarT >= 0 && iVarE >= 0 && iVarZ >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.h"
                        ,0x19c,
                        "int sat_solver_add_mux(sat_solver *, int, int, int, int, int, int, int, int)"
                       );
        }
        uVar3 = (uVar14 & 1) + uVar9 * 2 ^ 1;
        local_90 = (uVar15 & 1) + uVar12 * 2 ^ 1;
        local_94 = uVar3;
        local_8c = uVar13;
        local_54 = local_90;
        iVar6 = sat_solver_addclause(local_80,(lit *)&local_94,(lit *)&local_88);
        if (iVar6 == 0) {
          __assert_fail("Cid",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.h"
                        ,0x1a2,
                        "int sat_solver_add_mux(sat_solver *, int, int, int, int, int, int, int, int)"
                       );
        }
        uVar11 = uVar12 * 2 | uVar15 & 1;
        local_8c = local_88;
        local_94 = uVar3;
        local_90 = uVar11;
        iVar6 = sat_solver_addclause(local_80,(lit *)&local_94,(lit *)&local_88);
        uVar13 = local_84;
        if (iVar6 == 0) {
          __assert_fail("Cid",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.h"
                        ,0x1a8,
                        "int sat_solver_add_mux(sat_solver *, int, int, int, int, int, int, int, int)"
                       );
        }
        uVar3 = (uint)local_40 & 1;
        uVar14 = uVar9 * 2 | uVar14 & 1;
        uVar15 = uVar3 + uVar8 * 2 ^ 1;
        local_8c = local_84;
        local_94 = uVar14;
        local_90 = uVar15;
        iVar6 = sat_solver_addclause(local_80,(lit *)&local_94,(lit *)&local_88);
        if (iVar6 == 0) {
          __assert_fail("Cid",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.h"
                        ,0x1ae,
                        "int sat_solver_add_mux(sat_solver *, int, int, int, int, int, int, int, int)"
                       );
        }
        uVar3 = uVar8 * 2 | uVar3;
        local_8c = local_88;
        local_94 = uVar14;
        local_90 = uVar3;
        iVar6 = sat_solver_addclause(local_80,(lit *)&local_94,(lit *)&local_88);
        psVar2 = local_80;
        if (iVar6 == 0) {
          __assert_fail("Cid",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.h"
                        ,0x1b4,
                        "int sat_solver_add_mux(sat_solver *, int, int, int, int, int, int, int, int)"
                       );
        }
        pSat = local_80;
        if ((int)local_48 != (int)local_50) {
          local_8c = local_88;
          local_94 = uVar11;
          local_90 = uVar3;
          iVar6 = sat_solver_addclause(local_80,(lit *)&local_94,(lit *)&local_88);
          if (iVar6 == 0) {
            __assert_fail("Cid",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.h"
                          ,0x1bd,
                          "int sat_solver_add_mux(sat_solver *, int, int, int, int, int, int, int, int)"
                         );
          }
          local_94 = local_54;
          local_8c = uVar13;
          local_90 = uVar15;
          iVar6 = sat_solver_addclause(psVar2,(lit *)&local_94,(lit *)&local_88);
          pSat = local_80;
          if (iVar6 == 0) {
            __assert_fail("Cid",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.h"
                          ,0x1c3,
                          "int sat_solver_add_mux(sat_solver *, int, int, int, int, int, int, int, int)"
                         );
          }
        }
      }
      else if (iVar5 == 2) {
        if (((int)uVar14 < 0) || ((int)uVar15 < 0)) goto LAB_0053ac36;
        uVar13 = (uVar14 >> 1) + iVar4;
        uVar14 = (uVar15 >> 1) + iVar4;
        if ((int)(uVar13 | uVar3 | uVar14) < 0) {
          __assert_fail("iVarA >= 0 && iVarB >= 0 && iVarC >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.h"
                        ,0x17d,"int sat_solver_add_xor(sat_solver *, int, int, int, int)");
        }
        iVar6 = uVar13 * 2 + 1;
        uVar3 = uVar14 * 2 + 1;
        local_94 = uVar11;
        local_90 = iVar6;
        local_8c = uVar3;
        iVar5 = sat_solver_addclause(local_80,(lit *)&local_94,(lit *)&local_88);
        if (iVar5 == 0) {
          __assert_fail("Cid",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.h"
                        ,0x183,"int sat_solver_add_xor(sat_solver *, int, int, int, int)");
        }
        local_94 = uVar11;
        local_90 = uVar13 * 2;
        local_8c = uVar14 * 2;
        iVar5 = sat_solver_addclause(psVar2,(lit *)&local_94,(lit *)&local_88);
        uVar11 = local_84;
        if (iVar5 == 0) {
          __assert_fail("Cid",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.h"
                        ,0x189,"int sat_solver_add_xor(sat_solver *, int, int, int, int)");
        }
        local_94 = local_84;
        local_90 = iVar6;
        local_8c = uVar14 * 2;
        iVar6 = sat_solver_addclause(psVar2,(lit *)&local_94,(lit *)&local_88);
        if (iVar6 == 0) {
          __assert_fail("Cid",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.h"
                        ,399,"int sat_solver_add_xor(sat_solver *, int, int, int, int)");
        }
        local_94 = uVar11;
        local_90 = uVar13 * 2;
        local_8c = uVar3;
        iVar6 = sat_solver_addclause(psVar2,(lit *)&local_94,(lit *)&local_88);
        pSat = psVar2;
        uVar13 = local_84;
        if (iVar6 == 0) {
          __assert_fail("Cid",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.h"
                        ,0x195,"int sat_solver_add_xor(sat_solver *, int, int, int, int)");
        }
      }
      else {
        if (iVar5 != 1) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcFx.c"
                        ,0x29e,"void Bmc_FxAddClauses(sat_solver *, Vec_Int_t *, int, int)");
        }
        if (((int)uVar14 < 0) || ((int)uVar15 < 0)) goto LAB_0053ac36;
        uVar14 = uVar14 + local_78;
        local_94 = uVar11;
        local_90 = uVar14;
        iVar5 = sat_solver_addclause(pSat,(lit *)&local_94,(lit *)&local_8c);
        if (iVar5 == 0) {
          __assert_fail("Cid",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.h"
                        ,0x16b,"int sat_solver_add_and(sat_solver *, int, int, int, int, int, int)")
          ;
        }
        local_94 = uVar11;
        local_90 = uVar15 + iVar6;
        iVar5 = sat_solver_addclause(pSat,(lit *)&local_94,(lit *)&local_8c);
        if (iVar5 == 0) {
          __assert_fail("Cid",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.h"
                        ,0x170,"int sat_solver_add_and(sat_solver *, int, int, int, int, int, int)")
          ;
        }
        local_94 = local_84;
        local_90 = uVar14 ^ 1;
        local_8c = uVar15 + iVar6 ^ 1;
        iVar6 = sat_solver_addclause(pSat,(lit *)&local_94,(lit *)&local_88);
        uVar13 = local_84;
        if (iVar6 == 0) {
          __assert_fail("Cid",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.h"
                        ,0x176,"int sat_solver_add_and(sat_solver *, int, int, int, int, int, int)")
          ;
        }
      }
      lVar10 = local_60 + 4;
      uVar11 = local_88 - 2;
      uVar3 = local_74;
    } while (local_38 != lVar10);
  }
  return;
}

Assistant:

void Bmc_FxAddClauses( sat_solver * pSat, Vec_Int_t * vDivs, int iCiVarBeg, int iVarStart )
{
    int i, Func, pLits[3], nDivs = Vec_IntSize(vDivs)/4;
    assert( Vec_IntSize(vDivs) % 4 == 0 );
    // create new var for each divisor
    for ( i = 0; i < nDivs; i++ )
    {
        Func     = Vec_IntEntry(vDivs, 4*i+0);
        pLits[0] = Vec_IntEntry(vDivs, 4*i+1);
        pLits[1] = Vec_IntEntry(vDivs, 4*i+2);
        pLits[2] = Vec_IntEntry(vDivs, 4*i+3);
        //printf( "Adding clause with vars %d %d -> %d\n", iCiVarBeg + Abc_Lit2Var(pLits[0]), iCiVarBeg + Abc_Lit2Var(pLits[1]), iVarStart + nDivs - 1 - i );
        if ( Func == DIV_AND )
            sat_solver_add_and( pSat, 
                iVarStart + nDivs - 1 - i, iCiVarBeg + Abc_Lit2Var(pLits[0]), iCiVarBeg + Abc_Lit2Var(pLits[1]), 
                Abc_LitIsCompl(pLits[0]), Abc_LitIsCompl(pLits[1]), 0 );
        else if ( Func == DIV_XOR )
            sat_solver_add_xor( pSat, 
                iVarStart + nDivs - 1 - i, iCiVarBeg + Abc_Lit2Var(pLits[0]), iCiVarBeg + Abc_Lit2Var(pLits[1]), 0 );
        else if ( Func == DIV_MUX )
            sat_solver_add_mux( pSat, 
                iVarStart + nDivs - 1 - i, iCiVarBeg + Abc_Lit2Var(pLits[0]), iCiVarBeg + Abc_Lit2Var(pLits[1]), iCiVarBeg + Abc_Lit2Var(pLits[2]), 
                Abc_LitIsCompl(pLits[0]), Abc_LitIsCompl(pLits[1]), Abc_LitIsCompl(pLits[2]), 0 );
        else assert( 0 );
    }
}